

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::RuntimeCharTrie::CloneFrom
          (RuntimeCharTrie *this,ScriptContext *scriptContext,ArenaAllocator *allocator,
          CharTrie *other)

{
  int iVar1;
  CharTrieEntry *pCVar2;
  code *pcVar3;
  size_t requestedBytes;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RuntimeCharTrieEntry *pRVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  ThreadContext::ProbeStackNoDispose(scriptContext->threadContext,0x6000,scriptContext,(PVOID)0x0);
  iVar1 = other->count;
  this->count = iVar1;
  if ((long)iVar1 < 1) {
    this->children = (RuntimeCharTrieEntry *)0x0;
  }
  else {
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00e73d74;
      *puVar6 = 0;
    }
    requestedBytes = (long)iVar1 * 0x18;
    pRVar7 = (RuntimeCharTrieEntry *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal(&allocator->
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                           ,requestedBytes);
    if (pRVar7 == (RuntimeCharTrieEntry *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) {
LAB_00e73d74:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    sVar8 = 0;
    do {
      *(undefined4 *)((long)&(pRVar7->node).count + sVar8) = 0;
      *(undefined8 *)((long)&(pRVar7->node).children + sVar8) = 0;
      sVar8 = sVar8 + 0x18;
    } while (requestedBytes != sVar8);
    this->children = pRVar7;
    if (0 < this->count) {
      lVar11 = 8;
      lVar10 = 0;
      lVar9 = 8;
      do {
        pCVar2 = other->children;
        pRVar7 = this->children;
        *(undefined2 *)((long)pRVar7 + lVar11 + -8) = *(undefined2 *)((long)pCVar2 + lVar9 + -8);
        CloneFrom((RuntimeCharTrie *)((long)&pRVar7->c + lVar11),scriptContext,allocator,
                  (CharTrie *)((long)&pCVar2->c + lVar9));
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0x20;
        lVar11 = lVar11 + 0x18;
      } while (lVar10 < this->count);
    }
  }
  return;
}

Assistant:

void RuntimeCharTrie::CloneFrom(Js::ScriptContext* scriptContext, ArenaAllocator* allocator, const CharTrie& other)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);
        count = other.count;
        if (count > 0)
        {
            children = AnewArray(allocator, RuntimeCharTrieEntry, count);
            for (int i = 0; i < count; i++)
            {
                children[i].c = other.children[i].c;
                children[i].node.CloneFrom(scriptContext, allocator,  other.children[i].node);
            }
        }
        else
            children = 0;
    }